

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::Type::Type(Type *this,Tuple *tuple)

{
  ulong uVar1;
  pointer pTVar2;
  Type TVar3;
  
  pTVar2 = (tuple->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pTVar2 == (tuple->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      TVar3 = anon_unknown_0::TupleStore::insert
                        ((TupleStore *)wasm::(anonymous_namespace)::globalTupleStore,tuple);
      this->id = (uintptr_t)TVar3;
      return;
    }
    uVar1 = pTVar2->id;
  } while ((1 < uVar1) && (pTVar2 = pTVar2 + 1, (uVar1 & 1) == 0 || uVar1 < 7));
  __assert_fail("type.isSingle()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x263,"void wasm::(anonymous namespace)::validateTuple(const Tuple &)");
}

Assistant:

Type::Type(const Tuple& tuple) {
  validateTuple(tuple);
  new (this) Type(globalTupleStore.insert(tuple));
}